

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall kj::Maybe<kj::OwnFd>::Maybe(Maybe<kj::OwnFd> *this,Maybe<kj::OwnFd> *other)

{
  NullableValue<kj::OwnFd> *other_00;
  Maybe<kj::OwnFd> *other_local;
  Maybe<kj::OwnFd> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::OwnFd>>(&other->ptr);
  kj::_::NullableValue<kj::OwnFd>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }